

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

uint hash(char *s0,char *s1,char *s2,char *s3)

{
  uint uVar1;
  
  uVar1 = 0;
  for (; *s0 != '\0'; s0 = s0 + 1) {
    uVar1 = uVar1 * 0x1f + (int)*s0;
  }
  for (; *s1 != 0; s1 = s1 + 1) {
    uVar1 = uVar1 * 0x1f + (int)*s1;
  }
  for (; *s2 != 0; s2 = s2 + 1) {
    uVar1 = uVar1 * 0x1f + (int)*s2;
  }
  for (; *s3 != 0; s3 = s3 + 1) {
    uVar1 = uVar1 * 0x1f + (int)*s3;
  }
  return uVar1 % 0x5dc1;
}

Assistant:

unsigned hash(const char *s0, const char *s1, const char *s2, const char *s3)
{
    unsigned   hashval;

    for (hashval = 0; *s0 != '\0'; s0++)
        hashval = *s0 + 31*hashval;
    for (; *s1 != '\0'; s1++)
        hashval = *s1 + 31*hashval;
    for (; *s2 != '\0'; s2++)
        hashval = *s2 + 31*hashval;
    for (; *s3 != '\0'; s3++)
        hashval = *s3 + 31*hashval;

    return hashval % HASHSIZE;
}